

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

bool __thiscall
TPZMatrix<long>::SolveEigensystemJacobi
          (TPZMatrix<long> *this,int64_t *numiterations,REAL *tol,TPZVec<long> *Eigenvalues,
          TPZFMatrix<long> *Eigenvectors)

{
  double dVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  double dVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  long *plVar10;
  undefined4 extraout_var;
  long lVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int64_t i;
  int64_t i_4;
  int64_t j;
  ulong uVar12;
  int64_t size;
  TPZFNMatrix<9,_long> Matrix_1;
  TPZFNMatrix<9,_long> Matrix;
  double local_468;
  long local_410;
  TPZFMatrix<long> local_408;
  long local_378 [4];
  double local_358;
  undefined8 uStack_350;
  _func_int **local_340;
  _func_int **local_338;
  TPZFMatrix<long> local_330;
  long local_2a0 [10];
  TPZFMatrix<long> local_250;
  long local_1c0 [4];
  TPZFMatrix<long> local_1a0;
  long local_110 [10];
  TPZFMatrix<long> local_c0;
  
  lVar2 = *numiterations;
  dVar1 = *tol;
  uVar3 = (this->super_TPZBaseMatrix).fRow;
  local_1a0.fElem = local_110;
  local_1a0.super_TPZMatrix<long>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1a0.super_TPZMatrix<long>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_338 = (_func_int **)&PTR__TPZFMatrix_01846828;
  local_1a0.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01846828;
  local_1a0.fSize = 9;
  local_1a0.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow = uVar3;
  local_1a0.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol = uVar3;
  local_1a0.fGiven = local_1a0.fElem;
  TPZVec<int>::TPZVec(&local_1a0.fPivot.super_TPZVec<int>,0);
  local_1a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_1a0.fPivot.super_TPZVec<int>.fStore = local_1a0.fPivot.fExtAlloc;
  local_1a0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
  local_1a0.fWork.fStore = (long *)0x0;
  local_1a0.fWork.fNElements = 0;
  local_1a0.fWork.fNAlloc = 0;
  plVar10 = (long *)0x0;
  if ((uVar3 != 0) && (uVar9 = uVar3 * uVar3, plVar10 = local_1a0.fElem, 9 < uVar9)) {
    plVar10 = (long *)operator_new__(-(ulong)(uVar9 >> 0x3d != 0) | uVar9 * 8);
  }
  local_1a0.fElem = plVar10;
  local_340 = (_func_int **)&PTR__TPZFNMatrix_01846538;
  local_1a0.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01846538;
  if (0 < (long)uVar3) {
    uVar9 = 0;
    do {
      uVar12 = 0;
      do {
        iVar8 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                          (this,uVar9,uVar12);
        if ((local_1a0.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar9) ||
           (local_1a0.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol <= (long)uVar12)) {
          TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        local_1a0.fElem[local_1a0.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow * uVar12 + uVar9] =
             CONCAT44(extraout_var,iVar8);
        uVar12 = uVar12 + 1;
      } while (uVar3 != uVar12);
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar3);
  }
  bVar7 = SolveEigenvaluesJacobi(&local_1a0.super_TPZMatrix<long>,numiterations,tol,Eigenvalues);
  if (bVar7) {
    local_408.fElem = local_378;
    local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol = 1;
    local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018471e8;
    local_408.fSize = 3;
    local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow = uVar3;
    local_408.fGiven = local_408.fElem;
    TPZVec<int>::TPZVec(&local_408.fPivot.super_TPZVec<int>,0);
    local_408.fPivot.super_TPZVec<int>.fStore = local_408.fPivot.fExtAlloc;
    local_408.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_408.fPivot.super_TPZVec<int>.fNElements = 0;
    local_408.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_408.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    local_408.fWork.fStore = (long *)0x0;
    local_408.fWork.fNElements = 0;
    local_408.fWork.fNAlloc = 0;
    if (uVar3 == 0) {
      local_408.fElem = (long *)0x0;
    }
    else if (3 < (long)uVar3) {
      local_408.fElem = (long *)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
    }
    local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01846ef8;
    TPZFMatrix<long>::operator=(&local_408,0);
    local_250.fElem = local_1c0;
    local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol = 1;
    local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_018471e8;
    local_250.fSize = 3;
    local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow = uVar3;
    local_250.fGiven = local_250.fElem;
    TPZVec<int>::TPZVec(&local_250.fPivot.super_TPZVec<int>,0);
    local_250.fPivot.super_TPZVec<int>.fStore = local_250.fPivot.fExtAlloc;
    local_250.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
    local_250.fPivot.super_TPZVec<int>.fNElements = 0;
    local_250.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_250.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    local_250.fWork.fStore = (long *)0x0;
    local_250.fWork.fNElements = 0;
    local_250.fWork.fNAlloc = 0;
    if (uVar3 == 0) {
      local_250.fElem = (long *)0x0;
    }
    else if (3 < (long)uVar3) {
      local_250.fElem = (long *)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
    }
    local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_01846ef8;
    TPZFMatrix<long>::operator=(&local_250,0);
    (*(Eigenvectors->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(Eigenvectors,uVar3,uVar3);
    (*(Eigenvectors->super_TPZMatrix<long>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xf])(Eigenvectors);
    if (0 < (long)uVar3) {
      uVar9 = 0;
      do {
        uVar12 = 0;
        do {
          iVar8 = rand();
          local_408.fElem[uVar12] = (long)iVar8;
          uVar12 = uVar12 + 1;
        } while (uVar3 != uVar12);
        TPZFMatrix<long>::TPZFMatrix(&local_c0,this);
        local_330.fElem = local_2a0;
        local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow = 0;
        local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol = 0;
        local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             local_338;
        local_330.fSize = 9;
        local_330.fGiven = local_330.fElem;
        TPZVec<int>::TPZVec(&local_330.fPivot.super_TPZVec<int>,0);
        local_330.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
        local_330.fPivot.super_TPZVec<int>.fStore = local_330.fPivot.fExtAlloc;
        local_330.fPivot.super_TPZVec<int>.fNElements = 0;
        local_330.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_330.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
        local_330.fWork.fNAlloc = 0;
        local_330.fWork.fStore = (long *)0x0;
        local_330.fWork.fNElements = 0;
        local_330.fElem = (long *)0x0;
        local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             local_340;
        TPZFMatrix<long>::operator=(&local_330,&local_c0);
        TPZFMatrix<long>::~TPZFMatrix(&local_c0);
        lVar11 = ReturnNearestValue(Eigenvalues->fStore[uVar9],Eigenvalues,0);
        dVar6 = ABS((double)(lVar11 - Eigenvalues->fStore[uVar9]));
        if (dVar6 <= 1e-05) {
          uVar12 = 0;
          do {
            iVar8 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,uVar12,uVar12);
            local_330.fElem
            [(uVar12 & 0xffffffff) * local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow +
             uVar12] = CONCAT44(extraout_var_01,iVar8) - Eigenvalues->fStore[uVar9];
            uVar12 = uVar12 + 1;
          } while (uVar3 != uVar12);
        }
        else {
          uVar12 = 0;
          do {
            iVar8 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                              (this,uVar12,uVar12);
            local_330.fElem
            [(uVar12 & 0xffffffff) * local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow +
             uVar12] = (CONCAT44(extraout_var_00,iVar8) + (long)(dVar6 * 0.01)) -
                       Eigenvalues->fStore[uVar9];
            uVar12 = uVar12 + 1;
          } while (uVar3 != uVar12);
        }
        local_468 = 0.0;
        uVar12 = 0;
        do {
          if ((local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar12) ||
             (local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_358 = ABS((double)local_408.fElem[uVar12]);
          if (local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar12) {
            uStack_350 = 0;
            TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_468 = local_468 + local_358 * local_358;
          uVar12 = uVar12 + 1;
        } while (uVar3 != uVar12);
        if (local_468 < 0.0) {
          local_468 = sqrt(local_468);
        }
        else {
          local_468 = SQRT(local_468);
        }
        uVar12 = 0;
        do {
          if ((local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar12) ||
             (local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar12) {
            TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_408.fElem[uVar12] = local_408.fElem[uVar12] / (long)local_468;
          uVar12 = uVar12 + 1;
        } while (uVar3 != uVar12);
        if (-1 < lVar2 && dVar1 < 10.0) {
          local_410 = 0;
          do {
            uVar12 = 0;
            do {
              if ((local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar12) ||
                 (local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar12) ||
                 (local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_250.fElem[uVar12] = local_408.fElem[uVar12];
              uVar12 = uVar12 + 1;
            } while (uVar3 != uVar12);
            iVar8 = (*local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x10])(&local_330);
            if (iVar8 != 0) {
              Error("LU decomposition is not a symmetric decomposition",(char *)0x0);
            }
            iVar8 = (*local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable.
                      _vptr_TPZSavable[0x17])(&local_330);
            if (iVar8 != 0) {
              (*local_330.super_TPZMatrix<long>.super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0x43])(&local_330);
            }
            local_468 = 0.0;
            uVar12 = 0;
            do {
              if ((local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar12) ||
                 (local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_358 = ABS((double)local_408.fElem[uVar12]);
              if (local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar12) {
                uStack_350 = 0;
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_468 = local_468 + local_358 * local_358;
              uVar12 = uVar12 + 1;
            } while (uVar3 != uVar12);
            if (local_468 < 0.0) {
              dVar6 = sqrt(local_468);
            }
            else {
              dVar6 = SQRT(local_468);
            }
            local_468 = 0.0;
            uVar12 = 0;
            do {
              if ((local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar12) ||
                 (local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar12) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_408.fElem[uVar12] = local_408.fElem[uVar12] / (long)dVar6;
              if ((local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar12) ||
                 (local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar12) ||
                 (local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar12) ||
                 (local_250.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar12) ||
                 (local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_468 = local_468 +
                          ABS((double)((local_250.fElem[uVar12] - local_408.fElem[uVar12]) *
                                      (local_250.fElem[uVar12] - local_408.fElem[uVar12])));
              uVar12 = uVar12 + 1;
            } while (uVar3 != uVar12);
            if (local_468 < 0.0) {
              local_468 = sqrt(local_468);
            }
            else {
              local_468 = SQRT(local_468);
            }
          } while ((dVar1 < local_468) &&
                  (bVar5 = local_410 < lVar2, local_410 = local_410 + 1, bVar5));
        }
        uVar12 = 0;
        do {
          if ((local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fRow <= (long)uVar12) ||
             (local_408.super_TPZMatrix<long>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar11 = local_408.fElem[uVar12];
          if (ABS((double)lVar11) < 1e-05) {
            lVar11 = 0;
          }
          lVar4 = (Eigenvectors->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
          if ((lVar4 <= (long)uVar9) ||
             ((Eigenvectors->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol <= (long)uVar12)) {
            TPZFMatrix<long>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          Eigenvectors->fElem[lVar4 * uVar12 + uVar9] = lVar11;
          uVar12 = uVar12 + 1;
        } while (uVar3 != uVar12);
        TPZFMatrix<long>::~TPZFMatrix(&local_330,&PTR_PTR_018467f0);
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar3);
    }
    TPZFMatrix<long>::~TPZFMatrix(&local_250,&PTR_PTR_018471b0);
    TPZFMatrix<long>::~TPZFMatrix(&local_408,&PTR_PTR_018471b0);
  }
  TPZFMatrix<long>::~TPZFMatrix(&local_1a0,&PTR_PTR_018467f0);
  return bVar7;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}